

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

ColoredAp * __thiscall
dg::DOD::createAp(DOD *this,SparseBitvector *nodes,CDGraph *graph,CDNode *node)

{
  bool bVar1;
  size_t sVar2;
  CDNode *this_00;
  EdgesT *this_01;
  size_type sVar3;
  ColoredAp *in_RDX;
  unsigned_long in_RSI;
  ColoredAp *in_RDI;
  CDNode *gn;
  ContainedType *n_1;
  node_iterator __end2_1;
  node_iterator __begin2_1;
  CDGraph *__range2_1;
  ContainedType *n;
  node_iterator __end2;
  node_iterator __begin2;
  CDGraph *__range2;
  CDGraph *Ap;
  ColoredAp CAp;
  ColoredAp *in_stack_fffffffffffffe18;
  ColoredAp *this_02;
  CDNode *in_stack_fffffffffffffe38;
  ColoredAp *in_stack_fffffffffffffe40;
  ColoredAp *in_stack_fffffffffffffe50;
  iterator local_1a0;
  CDNode *local_198;
  undefined4 local_18c;
  ContainedType *local_188;
  iterator local_180;
  iterator local_178 [2];
  CDNode *local_168;
  CDNode local_160;
  anon_class_16_2_de1edd05 *in_stack_fffffffffffffee8;
  CDNode *in_stack_fffffffffffffef0;
  _Base_ptr in_stack_fffffffffffffef8;
  _Base_ptr in_stack_ffffffffffffff00;
  
  this_02 = in_RDI;
  ColoredAp::ColoredAp(in_stack_fffffffffffffe50);
  local_168 = &local_160;
  local_178[0]._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       CDGraph::begin(&in_stack_fffffffffffffe18->Ap);
  local_180._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       CDGraph::end(&in_stack_fffffffffffffe18->Ap);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)this_02,
                            (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_fffffffffffffe18), bVar1) {
    local_188 = CDGraph::node_iterator::operator*((node_iterator *)0x25e820);
    in_stack_fffffffffffffe18 = in_RDX;
    CDNode::getID(local_188);
    bVar1 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                   *)in_stack_fffffffffffffe38,in_RSI);
    if (bVar1) {
      ColoredAp::createNode(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
    ::operator++(local_178);
  }
  sVar2 = CDGraph::size((CDGraph *)0x25e87b);
  if (sVar2 < 3) {
    memset(this_02,0,0x138);
    ColoredAp::ColoredAp(in_stack_fffffffffffffe50);
  }
  else {
    local_198 = local_168;
    local_1a0._M_current =
         (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
         CDGraph::begin(&in_stack_fffffffffffffe18->Ap);
    CDGraph::end(&in_stack_fffffffffffffe18->Ap);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                               *)this_02,
                              (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                               *)in_stack_fffffffffffffe18), bVar1) {
      in_stack_fffffffffffffe50 =
           (ColoredAp *)CDGraph::node_iterator::operator*((node_iterator *)0x25e8f3);
      ColoredAp::getGNode(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe38 = &local_160;
      in_stack_fffffffffffffe40 = (ColoredAp *)&stack0xfffffffffffffe50;
      foreachFirstReachable<dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>,dg::DOD::createAp(dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,dg::CDGraph&,dg::CDNode*)::_lambda(dg::CDNode*)_1_>
                ((DOD *)in_stack_ffffffffffffff00,
                 (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                  *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
      ::operator++(&local_1a0);
    }
    this_00 = ColoredAp::getNode(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    this_01 = ElemWithEdges<dg::CDNode>::successors(&this_00->super_ElemWithEdges<dg::CDNode>);
    sVar3 = std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::size(this_01);
    if (sVar3 < 2) {
      memset(this_02,0,0x138);
      ColoredAp::ColoredAp(in_stack_fffffffffffffe50);
    }
    else {
      ColoredAp::ColoredAp(this_02,in_stack_fffffffffffffe18);
    }
  }
  local_18c = 1;
  ColoredAp::~ColoredAp(this_02);
  return in_RDI;
}

Assistant:

ColoredAp createAp(const ADT::SparseBitvector &nodes, CDGraph &graph,
                       CDNode *node) {
        ColoredAp CAp;
        CDGraph &Ap = CAp.Ap;

        // create nodes of graph
        for (auto *n : graph) {
            if (nodes.get(n->getID())) {
                CAp.createNode(n);
                // DBG(cda, "  - Ap has node " << n->getID() << " (which is " <<
                // nd->getID() << " in Ap)");
            }
        }

        assert(CAp.getNode(node) != nullptr);

        if (CAp.Ap.size() < 3) {
            return {}; // no DOD possible, bail out early
        }

        // Add edges. FIXME: we can use a better implementation
        for (auto *n : Ap) {
            auto *gn = CAp.getGNode(n);

            foreachFirstReachable(nodes, gn, [&](CDNode *cur) {
                auto *apn = CAp.getNode(cur);
                assert(apn);
                n->addSuccessor(apn);
                // DBG(cda, "  - Ap edge " << gn->getID() << " -> " <<
                // cur->getID());
            });
        }

        assert(CAp.getNode(node) && "node is not in Ap");
        if (CAp.getNode(node)->successors().size() < 2) {
            return {}; // no DOD possible, skip the rest of building colored Ap
        }

        return CAp;
    }